

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  UnitTestImpl *this_00;
  InternalRunDeathTestFlag *this_01;
  TestResult *this_02;
  char *pcVar3;
  char *pcVar4;
  vector<testing::internal::String,_std::allocator<testing::internal::String>_> *arguments;
  char **argv;
  int *piVar5;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  String local_d0;
  int local_c0;
  pid_t local_bc;
  int gtest_retval;
  pid_t child_pid;
  undefined1 local_a8 [8];
  Arguments args;
  String internal_flag;
  String filter_flag;
  String local_50;
  int local_3c;
  int local_38;
  int pipe_fd [2];
  int death_test_index;
  TestInfo *info;
  InternalRunDeathTestFlag *flag;
  UnitTestImpl *impl;
  ExecDeathTest *this_local;
  
  this_00 = GetUnitTestImpl();
  this_01 = UnitTestImpl::internal_run_death_test_flag(this_00);
  register0x00000000 = UnitTestImpl::current_test_info(this_00);
  this_02 = TestInfo::result(register0x00000000);
  pipe_fd[0] = TestResult::death_test_count(this_02);
  if (this_01 == (InternalRunDeathTestFlag *)0x0) {
    do {
      iVar2 = pipe(&local_3c);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        String::Format(&local_50,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x3ec,"pipe(pipe_fd) != -1");
        DeathTestAbort(&local_50);
        String::~String((String *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    do {
      iVar2 = fcntl(local_38,2,0);
      bVar1 = IsTrue(iVar2 != -1);
      if (!bVar1) {
        String::Format((String *)&filter_flag.length_,"CHECK failed: File %s, line %d: %s",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x3ef,"fcntl(pipe_fd[1], F_SETFD, 0) != -1");
        DeathTestAbort((String *)&filter_flag.length_);
        String::~String((String *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    pcVar3 = TestInfo::test_case_name(stack0xffffffffffffffd0);
    pcVar4 = TestInfo::name(stack0xffffffffffffffd0);
    String::Format((String *)&internal_flag.length_,"--%s%s=%s.%s","gtest_","filter",pcVar3,pcVar4);
    iVar2 = local_38;
    String::Format((String *)
                   &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,"--%s%s=%s|%d|%d|%d","gtest_",
                   "internal_run_death_test",this->file_,(ulong)(uint)this->line_,pipe_fd[0]);
    Arguments::Arguments((Arguments *)local_a8);
    arguments = GetArgvs();
    Arguments::AddArguments<testing::internal::String>((Arguments *)local_a8,arguments);
    pcVar3 = String::c_str((String *)&internal_flag.length_);
    Arguments::AddArgument((Arguments *)local_a8,pcVar3);
    pcVar3 = String::c_str((String *)
                           &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    Arguments::AddArgument((Arguments *)local_a8,pcVar3);
    String::String((String *)&gtest_retval,"");
    DeathTest::set_last_death_test_message((String *)&gtest_retval);
    String::~String((String *)CONCAT44(in_stack_fffffffffffffec4,iVar2));
    CaptureStderr();
    FlushInfoLog();
    argv = Arguments::Argv((Arguments *)local_a8);
    local_bc = ExecDeathTestFork(argv,local_3c);
    do {
      do {
        local_c0 = close(local_38);
        bVar1 = false;
        if (local_c0 == -1) {
          piVar5 = __errno_location();
          bVar1 = *piVar5 == 4;
        }
      } while (bVar1);
      if (local_c0 == -1) {
        String::Format(&local_d0,"CHECK failed: File %s, line %d: %s != -1",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/googletest/src/gtest-death-test.cc"
                       ,0x406,"close(pipe_fd[1])");
        DeathTestAbort(&local_d0);
        String::~String((String *)CONCAT44(in_stack_fffffffffffffec4,iVar2));
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    ForkingDeathTest::set_child_pid(&this->super_ForkingDeathTest,local_bc);
    DeathTestImpl::set_read_fd((DeathTestImpl *)this,local_3c);
    DeathTestImpl::set_spawned((DeathTestImpl *)this,true);
    this_local._4_4_ = OVERSEE_TEST;
    Arguments::~Arguments((Arguments *)local_a8);
    String::~String((String *)CONCAT44(in_stack_fffffffffffffec4,iVar2));
    String::~String((String *)CONCAT44(in_stack_fffffffffffffec4,iVar2));
  }
  else {
    iVar2 = InternalRunDeathTestFlag::write_fd(this_01);
    DeathTestImpl::set_write_fd((DeathTestImpl *)this,iVar2);
    this_local._4_4_ = EXECUTE_TEST;
  }
  return this_local._4_4_;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const String filter_flag =
      String::Format("--%s%s=%s.%s",
                     GTEST_FLAG_PREFIX_, kFilterFlag,
                     info->test_case_name(), info->name());
  const String internal_flag =
      String::Format("--%s%s=%s|%d|%d|%d",
                     GTEST_FLAG_PREFIX_, kInternalRunDeathTestFlag,
                     file_, line_, death_test_index, pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvs());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestFork(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}